

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_noshout(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CHAR_DATA *ch_00;
  char *__format;
  char *pcVar5;
  char buf [4608];
  char arg [4608];
  char acStack_2418 [4608];
  char local_1218 [4608];
  
  one_argument(argument,local_1218);
  if (local_1218[0] == '\0') {
    pcVar5 = "Noshout whom?\n\r";
  }
  else {
    ch_00 = get_char_world(ch,local_1218);
    if (ch_00 == (CHAR_DATA *)0x0) {
      pcVar5 = "They aren\'t here.\n\r";
    }
    else {
      bVar2 = is_npc(ch_00);
      if (bVar2) {
        pcVar5 = "Not on NPC\'s.\n\r";
      }
      else {
        iVar3 = get_trust(ch_00);
        iVar4 = get_trust(ch);
        if (iVar3 < iVar4) {
          uVar1 = ch_00->comm[0];
          if (((uint)uVar1 >> 0x14 & 1) == 0) {
            ch_00->comm[0] = uVar1 | 0x100000;
            send_to_char("You can\'t shout!\n\r",ch_00);
            send_to_char("NOSHOUT set.\n\r",ch);
            pcVar5 = ch_00->name;
            __format = "$N revokes %s\'s shouts.";
          }
          else {
            ch_00->comm[0] = uVar1 & 0xffffffffffefffff;
            send_to_char("You can shout again.\n\r",ch_00);
            send_to_char("NOSHOUT removed.\n\r",ch);
            pcVar5 = ch_00->name;
            __format = "$N restores shouts to %s.";
          }
          sprintf(acStack_2418,__format,pcVar5);
          wiznet(acStack_2418,ch,(OBJ_DATA *)0x0,9,0xc,0);
          return;
        }
        pcVar5 = "You failed.\n\r";
      }
    }
  }
  send_to_char(pcVar5,ch);
  return;
}

Assistant:

void do_noshout(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH], buf[MAX_STRING_LENGTH];
	CHAR_DATA *victim;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Noshout whom?\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("Not on NPC's.\n\r", ch);
		return;
	}

	if (get_trust(victim) >= get_trust(ch))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	if (IS_SET(victim->comm, COMM_NOSHOUT))
	{
		REMOVE_BIT(victim->comm, COMM_NOSHOUT);

		send_to_char("You can shout again.\n\r", victim);
		send_to_char("NOSHOUT removed.\n\r", ch);

		sprintf(buf, "$N restores shouts to %s.", victim->name);
		wiznet(buf, ch, nullptr, WIZ_PENALTIES, WIZ_SECURE, 0);
	}
	else
	{
		SET_BIT(victim->comm, COMM_NOSHOUT);

		send_to_char("You can't shout!\n\r", victim);
		send_to_char("NOSHOUT set.\n\r", ch);

		sprintf(buf, "$N revokes %s's shouts.", victim->name);
		wiznet(buf, ch, nullptr, WIZ_PENALTIES, WIZ_SECURE, 0);
	}
}